

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O3

void __thiscall
SchnorrPubkey_TweakTest_Test::~SchnorrPubkey_TweakTest_Test(SchnorrPubkey_TweakTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SchnorrPubkey, TweakTest) {
  // https://planethouki.wordpress.com/2018/03/15/pubkey-add-ecdsa/
  Privkey sk_a("1d52f68124c59c3125d5c2e043cabf01cef46fafaf45be3132fc1f52ff0ec434");
  Privkey sk_b("353a88e3c404380d9970d9b2d8ee9f6051b3d817ab32aabc12f5c3c65086e659");
  std::string exp_sk_c = "528d7f64e8c9d43ebf469c931cb95e6220a847c75a7868ed45f1e3194f95aa8d";
  std::string exp_pk_c = "c6cf31d72599553158c6ffed6139946bbd3a1648a6b1ef56bea812878bb2df71";
  Pubkey pk("03c6cf31d72599553158c6ffed6139946bbd3a1648a6b1ef56bea812878bb2df71");

  auto pk_a = SchnorrPubkey::FromPrivkey(sk_a);
  auto pk_b = SchnorrPubkey::FromPrivkey(sk_b);
  ByteData256 tweak1 = ByteData256(pk_b.GetData());

  auto pk_c1 = pk_a + tweak1;
  auto pk_c2 = pk_b;
  pk_c2 += tweak1;

  auto pk_c3 = pk_a - tweak1;
  auto pk_c4 = pk_b;
  pk_c2 -= tweak1;

  auto pk_c5 = pk_a.CreateTweakAdd(pk_b);

  auto sk_c = sk_a + sk_b;
  auto pk_c11 = SchnorrPubkey::FromPrivkey(sk_c);
  auto pk_c12 = SchnorrPubkey::FromPubkey(pk);

  EXPECT_NE(exp_pk_c, pk_c1.GetHex());  // tweak
  EXPECT_NE(exp_pk_c, pk_c2.GetHex());  // tweak
  EXPECT_NE(exp_pk_c, pk_c3.GetHex());  // tweak
  EXPECT_NE(exp_pk_c, pk_c4.GetHex());  // tweak
  EXPECT_NE(exp_pk_c, pk_c5.GetHex());  // tweak
  EXPECT_EQ(exp_pk_c, pk_c11.GetHex());  // combine
  EXPECT_EQ(exp_pk_c, pk_c12.GetHex());
  EXPECT_EQ(exp_sk_c, sk_c.GetHex());
}